

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# pod_vector.h
# Opt level: O2

void __thiscall
bk_lib::pod_vector<int,std::allocator<int>>::insert_impl<unsigned_int,bk_lib::detail::Fill<int>>
          (pod_vector<int,std::allocator<int>> *this,iterator pos,uint n,Fill<int> *pred)

{
  void *__src;
  size_type sVar1;
  int *__dest;
  
  if (*(uint *)(this + 0xc) < *(uint *)(this + 8) + n) {
    sVar1 = pod_vector<int,_std::allocator<int>_>::grow_size
                      ((pod_vector<int,_std::allocator<int>_> *)this,n);
    __dest = __gnu_cxx::new_allocator<int>::allocate
                       ((new_allocator<int> *)this,(ulong)sVar1,(void *)0x0);
    __src = *(void **)this;
    if (__src != (void *)0x0) {
      memcpy(__dest,__src,(long)pos - (long)__src & 0x3fffffffc);
    }
    detail::Fill<int>::operator()
              (pred,__dest + ((ulong)((long)pos - (long)__src) >> 2 & 0xffffffff),(ulong)n);
    if (pos != (iterator)0x0) {
      memcpy(__dest + ((ulong)((long)pos - (long)__src) >> 2 & 0xffffffff) + n,pos,
             ((ulong)*(uint *)(this + 8) * 4 + *(long *)this) - (long)pos);
    }
    pod_vector<int,_std::allocator<int>_>::ebo::release((ebo *)this);
    *(int **)this = __dest;
    *(uint *)(this + 8) = *(int *)(this + 8) + n;
    *(size_type *)(this + 0xc) = sVar1;
  }
  else {
    if (pos != (iterator)0x0) {
      memmove(pos + n,pos,((ulong)*(uint *)(this + 8) * 4 + *(long *)this) - (long)pos);
    }
    detail::Fill<int>::operator()(pred,pos,(ulong)n);
    *(uint *)(this + 8) = *(int *)(this + 8) + n;
  }
  return;
}

Assistant:

void insert_impl(iterator pos, ST n, const P& pred) {
		assert(n == 0 || (size()+n) > size() );
		if (size()+n <= capacity()) {
			move_right(pos, n);
			pred(pos, n);
			ebo_.size += n;
		}
		else {
			size_type new_cap = grow_size(n);
			pointer temp      = ebo_.allocate(new_cap);
			size_type prefix  = static_cast<size_type>(pos-begin());
			// copy prefix
			if (const_pointer buf = begin()) {
				std::memcpy(temp, buf, prefix*sizeof(T));
			}
			// insert new stuff
			pred(temp+prefix, n);
			// copy suffix
			if (pos) {
				std::memcpy(temp+prefix+n, pos, (end()-pos)*sizeof(T));
			}
			ebo_.release();
			ebo_.buf  = temp;
			ebo_.size+= n;
			ebo_.cap  = new_cap;
		}
	}